

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O0

void sysbvm_error(char *message)

{
  sysbvm_context_t *context;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t errorException;
  sysbvm_tuple_t errorString;
  sysbvm_context_t *activeContext;
  char *message_local;
  
  context = sysbvm_stackFrame_getActiveContext();
  if (context == (sysbvm_context_t *)0x0) {
    fprintf(_stderr,"%s\n",message);
    abort();
  }
  sVar1 = sysbvm_string_createWithCString(context,message);
  sVar1 = sysbvm_error_createWithMessageText(context,sVar1);
  sysbvm_exception_signal(context,sVar1);
  return;
}

Assistant:

SYSBVM_API void sysbvm_error(const char *message)
{
    sysbvm_context_t *activeContext = sysbvm_stackFrame_getActiveContext();
    if(!activeContext)
    {
        fprintf(stderr, "%s\n", message);
        abort();
    }

    sysbvm_tuple_t errorString = sysbvm_string_createWithCString(activeContext, message);
    sysbvm_tuple_t errorException = sysbvm_error_createWithMessageText(activeContext, errorString);
    sysbvm_exception_signal(activeContext, errorException);
}